

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::connectInterfaces
          (CoreBroker *this,BasicHandleInfo *origin,uint32_t originFlags,BasicHandleInfo *target,
          uint32_t targetFlags,
          pair<helics::action_message_def::action_t,_helics::action_message_def::action_t> actions)

{
  size_type sVar1;
  undefined4 fedid;
  route_id rVar2;
  undefined1 auVar3 [16];
  string_view name;
  string_view name_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  undefined1 local_e8 [8];
  undefined1 local_e0 [12];
  InterfaceHandle IStack_d4;
  uint16_t local_ce;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  ActionMessage::ActionMessage((ActionMessage *)local_e8,actions.first);
  local_e0._8_4_ = (target->handle).fed_id.gid;
  local_e0._0_4_ = (origin->handle).fed_id;
  local_e0._4_4_ = (origin->handle).handle;
  IStack_d4.hid = (target->handle).handle.hid;
  local_ce = (uint16_t)originFlags;
  name._M_str = (origin->key)._M_dataplus._M_p;
  name._M_len = (origin->key)._M_string_length;
  ActionMessage::name((ActionMessage *)local_e8,name);
  sVar1 = (origin->type)._M_string_length;
  if (sVar1 != 0) {
    str._M_str = (origin->type)._M_dataplus._M_p;
    str._M_len = sVar1;
    ActionMessage::setString((ActionMessage *)local_e8,0,str);
  }
  sVar1 = (origin->units)._M_string_length;
  if (sVar1 != 0) {
    str_00._M_str = (origin->units)._M_dataplus._M_p;
    str_00._M_len = sVar1;
    ActionMessage::setString((ActionMessage *)local_e8,1,str_00);
  }
  rVar2 = getRoute(this,(GlobalFederateId)local_e0._8_4_);
  (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar2.rid,local_e8);
  ActionMessage::setAction((ActionMessage *)local_e8,actions.second);
  name_00._M_str = (target->key)._M_dataplus._M_p;
  name_00._M_len = (target->key)._M_string_length;
  ActionMessage::name((ActionMessage *)local_e8,name_00);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_48);
  sVar1 = (target->type)._M_string_length;
  if (sVar1 != 0) {
    str_01._M_str = (target->type)._M_dataplus._M_p;
    str_01._M_len = sVar1;
    ActionMessage::setString((ActionMessage *)local_e8,0,str_01);
  }
  sVar1 = (target->units)._M_string_length;
  if (sVar1 != 0) {
    str_02._M_str = (target->units)._M_dataplus._M_p;
    str_02._M_len = sVar1;
    ActionMessage::setString((ActionMessage *)local_e8,1,str_02);
  }
  local_ce = (uint16_t)targetFlags;
  fedid = local_e0._0_4_;
  auVar3._0_8_ = local_e0._8_8_;
  auVar3._8_4_ = local_e0._0_4_;
  auVar3._12_4_ = local_e0._4_4_;
  _local_e0 = auVar3;
  rVar2 = getRoute(this,(GlobalFederateId)fedid);
  (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar2.rid,local_e8);
  ActionMessage::~ActionMessage((ActionMessage *)local_e8);
  return;
}

Assistant:

void CoreBroker::connectInterfaces(
    const BasicHandleInfo& origin,
    uint32_t originFlags,
    const BasicHandleInfo& target,
    uint32_t targetFlags,
    std::pair<action_message_def::action_t, action_message_def::action_t> actions)
{
    // notify the target about an origin
    ActionMessage connect(actions.first);
    connect.setSource(origin.handle);
    connect.setDestination(target.handle);
    connect.flags = originFlags;
    connect.name(origin.key);
    if (!origin.type.empty()) {
        connect.setString(typeStringLoc, origin.type);
    }
    if (!origin.units.empty()) {
        connect.setString(unitStringLoc, origin.units);
    }
    transmit(getRoute(connect.dest_id), connect);

    connect.setAction(actions.second);
    connect.name(target.key);
    connect.clearStringData();
    if (!target.type.empty()) {
        connect.setString(typeStringLoc, target.type);
    }
    if (!target.units.empty()) {
        connect.setString(unitStringLoc, target.units);
    }

    connect.flags = targetFlags;

    connect.swapSourceDest();
    transmit(getRoute(connect.dest_id), connect);
}